

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboColorTexCubeCase::render(FboColorTexCubeCase *this,Surface *dst)

{
  deUint32 target;
  deUint32 internalFormat;
  ulong uVar1;
  bool bVar2;
  deUint32 dVar3;
  DataType DVar4;
  deUint32 program;
  int iVar5;
  int iVar6;
  char *str;
  DataTypes *samplerTypes;
  Context *pCVar7;
  TransferFormat TVar8;
  undefined1 *this_00;
  size_type sVar9;
  deUint32 *pdVar10;
  reference pvVar11;
  void *data_00;
  ContextWrapper *this_01;
  Vector<float,_3> local_584;
  undefined1 local_578 [8];
  Vec3 p1;
  Vec3 p0;
  Vector<float,_3> local_554;
  PixelBufferAccess local_548;
  Vector<float,_4> local_520;
  Vec4 local_510;
  PixelBufferAccess local_500;
  TextureFormat local_4d8;
  undefined1 local_4d0 [8];
  TextureLevel data;
  IVec2 *viewport;
  deUint32 fbo;
  deUint32 tmpTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  int face;
  int ndx_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_478;
  value_type_conflict1 local_46c;
  ulong local_468;
  size_t n;
  vector<int,_std::allocator<int>_> order;
  int local_440;
  deUint32 layerFbo;
  int ndx_1;
  int ndx;
  IVec2 *size;
  bool isFilterable;
  deUint32 local_41c;
  deUint32 dStack_418;
  TransferFormat transferFmt;
  deUint32 tex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  deUint32 cubeTexShaderID;
  deUint32 texToFboShaderID;
  undefined1 local_3e8 [8];
  TextureCubeShader cubeTexShader;
  DataTypes local_238;
  undefined1 local_218 [8];
  Texture2DShader texToFboShader;
  TextureFormatInfo fmtInfo;
  TextureFormat local_30;
  TextureFormat texFmt;
  Random rnd;
  Surface *dst_local;
  FboColorTexCubeCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&texFmt,dVar3 ^ 0x9eef603d);
  local_30 = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&texToFboShader.field_0x194,&local_30);
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_238);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_238,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&local_30);
  tcu::operator-((tcu *)&cubeTexShader.m_outputType,
                 (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_218,samplerTypes,DVar4,(Vec4 *)&cubeTexShader.m_outputType,
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_238);
  DVar4 = glu::getSamplerCubeType(local_30);
  FboTestUtil::TextureCubeShader::TextureCubeShader
            ((TextureCubeShader *)local_3e8,DVar4,TYPE_FLOAT_VEC4);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  dVar3 = (*pCVar7->_vptr_Context[0x75])(pCVar7,local_218);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,local_3e8);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_218,pCVar7,dVar3);
  FboTestUtil::TextureCubeShader::setTexScaleBias
            ((TextureCubeShader *)local_3e8,(Vec4 *)(fmtInfo.valueMax.m_data + 2),
             (Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  TVar8 = glu::getTransferFormat(local_30);
  bVar2 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  this_00 = &(this->super_FboColorbufferCase).field_0x8c;
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
             &transferFmt.format);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,
             transferFmt.format);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,0x2802,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,0x2803,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,0x2801,
             bVar2 | 0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,0x2800,
             bVar2 | 0x2600);
  for (layerFbo = 0; (int)layerFbo < 6; layerFbo = layerFbo + 1) {
    target = render::cubeGLFaces[(int)layerFbo];
    internalFormat = (this->super_FboColorbufferCase).m_format;
    iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this_00);
    iVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)this_00);
    local_41c = TVar8.format;
    dStack_418 = TVar8.dataType;
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,target,0,
               internalFormat,iVar5,iVar6,0,local_41c,dStack_418,(void *)0x0);
  }
  FboTestCase::checkError((FboTestCase *)this);
  for (local_440 = 0; local_440 < 6; local_440 = local_440 + 1) {
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
               (deUint32 *)
               ((long)&order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_);
    sglr::ContextWrapper::glFramebufferTexture2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,render::cubeGLFaces[local_440],transferFmt.format,0);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType,
               (value_type_conflict2 *)
               ((long)&order.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4));
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&n);
  local_468 = 0;
  while( true ) {
    uVar1 = local_468;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType)
    ;
    if (sVar9 <= uVar1) break;
    local_46c = (value_type_conflict1)local_468;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&n,&local_46c);
    local_468 = local_468 + 1;
  }
  local_478._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&n)
  ;
  _face = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&n);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&texFmt,local_478,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_face);
  for (format = 0; (int)format < 4; format = format + 1) {
    pdVar10 = (deUint32 *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&n,(long)(int)format);
    dataType = *pdVar10;
    texW = 0x1908;
    texH = 0x1401;
    tmpTex = 0x80;
    fbo = 0x80;
    viewport._4_4_ = 0;
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &transferFmt.dataType,(long)(int)dataType);
    viewport._0_4_ = *pvVar11;
    data.m_data.m_cap = (size_t)&(this->super_FboColorbufferCase).field_0x8c;
    local_4d8 = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_4d0,&local_4d8,0x80,0x80,1);
    tcu::TextureLevel::getAccess(&local_500,(TextureLevel *)local_4d0);
    generateRandomColor((Functional *)&local_510,(Random *)&texFmt);
    tcu::Vector<float,_4>::Vector(&local_520,0.0);
    tcu::fillWithGrid(&local_500,8,&local_510,&local_520);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
               (deUint32 *)((long)&viewport + 4));
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               viewport._4_4_);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2601);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2601);
    tcu::TextureLevel::getAccess(&local_548,(TextureLevel *)local_4d0);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_548);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               0x1908,0x80,0x80,0,0x1908,0x1401,data_00);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               (value_type)viewport);
    iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)data.m_data.m_cap);
    iVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)data.m_data.m_cap);
    sglr::ContextWrapper::glViewport
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,iVar5,
               iVar6);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_554,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p0.m_data + 1),1.0,1.0,0.0);
    sglr::drawQuad(pCVar7,dVar3,&local_554,(Vec3 *)(p0.m_data + 1));
    FboTestCase::checkError((FboTestCase *)this);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(p1.m_data + 1),(float)((int)format % 2) - 1.0,
               (float)((int)format / 2) - 1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_584,1.0,1.0,0.0);
    tcu::operator+((tcu *)local_578,(Vector<float,_3> *)(p1.m_data + 1),&local_584);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0);
    this_01 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
    iVar5 = sglr::ContextWrapper::getWidth(this_01);
    iVar6 = sglr::ContextWrapper::getHeight
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::ContextWrapper::glViewport(this_01,0,0,iVar5,iVar6);
    sglr::ContextWrapper::glActiveTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c0);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8513,
               transferFmt.format);
    FboTestUtil::TextureCubeShader::setFace
              ((TextureCubeShader *)local_3e8,render::cubeTexFaces[(int)dataType]);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    FboTestUtil::TextureCubeShader::setUniforms((TextureCubeShader *)local_3e8,pCVar7,program);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::drawQuad(pCVar7,program,(Vec3 *)(p1.m_data + 1),(Vec3 *)local_578);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_4d0);
  }
  iVar5 = sglr::ContextWrapper::getWidth
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  iVar6 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar5,iVar6);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&n);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  FboTestUtil::TextureCubeShader::~TextureCubeShader((TextureCubeShader *)local_3e8);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_218);
  de::Random::~Random((Random *)&texFmt);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		static const deUint32 cubeGLFaces[] =
		{
			GL_TEXTURE_CUBE_MAP_POSITIVE_X,
			GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
			GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
			GL_TEXTURE_CUBE_MAP_NEGATIVE_Z
		};

		static const tcu::CubeFace cubeTexFaces[] =
		{
			tcu::CUBEFACE_POSITIVE_X,
			tcu::CUBEFACE_POSITIVE_Y,
			tcu::CUBEFACE_POSITIVE_Z,
			tcu::CUBEFACE_NEGATIVE_X,
			tcu::CUBEFACE_NEGATIVE_Y,
			tcu::CUBEFACE_NEGATIVE_Z
		};

		de::Random				rnd					(deStringHash(getName()) ^ 0x9eef603d);
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		TextureCubeShader		cubeTexShader		(glu::getSamplerCubeType(texFmt), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				cubeTexShaderID		= getCurrentContext()->createProgram(&cubeTexShader);

		// Setup shaders
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		cubeTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(texFmt);
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec2&			size			= m_texSize;


			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_CUBE_MAP,		tex);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_CUBE_MAP,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);

			// Generate an image and FBO for each cube face
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cubeGLFaces); ndx++)
				glTexImage2D(cubeGLFaces[ndx], 0, m_format, size.x(), size.y(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);
			checkError();

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cubeGLFaces); ndx++)
			{
				deUint32			layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, cubeGLFaces[ndx], tex, 0);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		// Render test images to random cube faces
		std::vector<int> order;

		for (size_t n = 0; n < fbos.size(); n++)
			order.push_back((int)n);
		rnd.shuffle(order.begin(), order.end());

		DE_ASSERT(order.size() >= 4);
		for (int ndx = 0; ndx < 4; ndx++)
		{
			const int			face		= order[ndx];
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			const deUint32		fbo			= fbos[face];
			const IVec2&		viewport	= m_texSize;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			checkError();

			// Render to framebuffer
			{
				const Vec3		p0	= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
				const Vec3		p1	= p0 + Vec3(1.0f, 1.0f, 0.0f);

				glBindFramebuffer(GL_FRAMEBUFFER, 0);
				glViewport(0, 0, getWidth(), getHeight());

				glActiveTexture(GL_TEXTURE0);
				glBindTexture(GL_TEXTURE_CUBE_MAP, tex);

				cubeTexShader.setFace(cubeTexFaces[face]);
				cubeTexShader.setUniforms(*getCurrentContext(), cubeTexShaderID);

				sglr::drawQuad(*getCurrentContext(), cubeTexShaderID, p0, p1);
				checkError();
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}